

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void __thiscall spatial_region::f_init_uniformB(spatial_region *this,double a0y,double a0z)

{
  celle ***pppcVar1;
  cellb ***pppcVar2;
  int *in_RDI;
  field3d<cellb> *in_XMM0_Qa;
  double in_XMM1_Qa;
  int k;
  int j;
  int i;
  int in_stack_ffffffffffffffbc;
  field3d<cellb> *in_stack_ffffffffffffffc0;
  int local_24;
  int local_20;
  int local_1c;
  
  for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < in_RDI[1]; local_20 = local_20 + 1) {
      for (local_24 = 0; local_24 < in_RDI[2]; local_24 = local_24 + 1) {
        pppcVar1 = field3d<celle>::operator[]
                             ((field3d<celle> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc)
        ;
        (*pppcVar1)[local_20][local_24].ex = 0.0;
        pppcVar1 = field3d<celle>::operator[]
                             ((field3d<celle> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc)
        ;
        (*pppcVar1)[local_20][local_24].ey = 0.0;
        pppcVar1 = field3d<celle>::operator[]
                             ((field3d<celle> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc)
        ;
        (*pppcVar1)[local_20][local_24].ez = 0.0;
        pppcVar2 = field3d<cellb>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        (*pppcVar2)[local_20][local_24].bx = 0.0;
        in_stack_ffffffffffffffc0 = in_XMM0_Qa;
        pppcVar2 = field3d<cellb>::operator[](in_XMM0_Qa,in_stack_ffffffffffffffbc);
        (*pppcVar2)[local_20][local_24].by = (double)in_stack_ffffffffffffffc0;
        pppcVar2 = field3d<cellb>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        (*pppcVar2)[local_20][local_24].bz = in_XMM1_Qa;
      }
    }
  }
  return;
}

Assistant:

void spatial_region::f_init_uniformB(double a0y, double a0z) {
    for(int i = 0; i < nx; ++i) {
        for(int j = 0; j < ny; ++j) {
            for(int k = 0; k < nz; ++k) {
                ce[i][j][k].ex = 0;
                ce[i][j][k].ey = 0;
                ce[i][j][k].ez = 0;
                cb[i][j][k].bx = 0;
                cb[i][j][k].by = a0y;
                cb[i][j][k].bz = a0z;
            }
        }
    }
}